

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U64 ZSTD_ipow(U64 base,U64 exponent)

{
  undefined8 local_20;
  U64 power;
  U64 exponent_local;
  U64 base_local;
  
  local_20 = 1;
  exponent_local = base;
  for (power = exponent; power != 0; power = power >> 1) {
    if ((power & 1) != 0) {
      local_20 = exponent_local * local_20;
    }
    exponent_local = exponent_local * exponent_local;
  }
  return local_20;
}

Assistant:

static U64 ZSTD_ipow(U64 base, U64 exponent)
{
    U64 power = 1;
    while (exponent) {
      if (exponent & 1) power *= base;
      exponent >>= 1;
      base *= base;
    }
    return power;
}